

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O0

void __thiscall M_tree::insert_leaf(M_tree *this,string *key,int n)

{
  value_type pNVar1;
  bool bVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  uint32_t len;
  size_type sVar5;
  reference pvVar6;
  Node *pNVar7;
  char *pcVar8;
  ostream *poVar9;
  reference ppNVar10;
  Node *pNVar11;
  iterator iVar12;
  iterator iVar13;
  size_type sVar14;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  undefined8 in_stack_ffffffffffeffae8;
  undefined8 in_stack_ffffffffffeffaf0;
  undefined8 in_stack_ffffffffffeffaf8;
  int iVar15;
  int j_2;
  undefined8 in_stack_ffffffffffeffb60;
  undefined8 in_stack_ffffffffffeffb68;
  undefined8 in_stack_ffffffffffeffb70;
  int j_1;
  undefined8 in_stack_ffffffffffeffbb8;
  undefined8 in_stack_ffffffffffeffbc0;
  undefined8 in_stack_ffffffffffeffbc8;
  int j;
  const_iterator in_stack_ffffffffffeffc20;
  long in_stack_ffffffffffeffd38;
  ifstream file;
  int iVar16;
  int i;
  int n_1;
  hash_add_key hasha;
  uint32_t newhash [8];
  Node *up;
  Node *leaff;
  Node *item2;
  Node *item;
  char byte_file [1048576];
  int n_local;
  string *key_local;
  M_tree *this_local;
  
  if (n == 1) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->file_names_p);
    for (iVar16 = 0; iVar16 < (int)sVar5; iVar16 = iVar16 + 1) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->file_names_p,(long)iVar16);
      bVar2 = std::operator<(key,pvVar6);
      if (bVar2) {
        pNVar7 = (Node *)operator_new(0x50);
        Node::Node(pNVar7);
        pNVar7->right = (Node *)0x0;
        pNVar7->left = (Node *)0x0;
        item2 = pNVar7;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pNVar7,key);
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffeffcd8,(string *)&this->folder_name1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffeffcb8,"/",(allocator *)&stack0xffffffffffeffcb7);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffcf8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffcd8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffd18,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffeffcf8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        _Var4 = std::operator|(_S_in,_S_bin);
        std::ifstream::ifstream(&stack0xffffffffffeffd38,pcVar8,_Var4);
        std::__cxx11::string::~string((string *)&stack0xffffffffffeffd18);
        std::__cxx11::string::~string((string *)&stack0xffffffffffeffcf8);
        std::__cxx11::string::~string((string *)&stack0xffffffffffeffcb8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffeffcb7);
        std::__cxx11::string::~string((string *)&stack0xffffffffffeffcd8);
        bVar3 = std::ios::operator!((ios *)(&stack0xffffffffffeffd38 +
                                           *(long *)(in_stack_ffffffffffeffd38 + -0x18)));
        if ((bVar3 & 1) == 0) {
          memset(&item,0,0x100000);
          std::istream::read(&stack0xffffffffffeffd38,(long)&item);
          poVar9 = std::operator<<((ostream *)&std::cout,"inserting the file: ");
          poVar9 = std::operator<<(poVar9,(string *)key);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          len = std::istream::gcount();
          sha256((uint8_t *)&item,len,item2->hashn);
          std::ifstream::close();
          this_00 = &this->point_p;
          ppNVar10 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](this_00,(long)iVar16);
          pNVar1 = *ppNVar10;
          std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
          __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
          operator+((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                    &stack0xffffffffffeffc10,(long)iVar16);
          __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
          __normal_iterator<Node**>
                    ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                     &stack0xffffffffffeffc20,
                     (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                     &stack0xffffffffffeffc18);
          std::vector<Node_*,_std::allocator<Node_*>_>::insert
                    (this_00,in_stack_ffffffffffeffc20,&item2);
          if ((pNVar1->parent->left == pNVar1) && (pNVar1->parent->right == (Node *)0x0)) {
            pNVar1->parent->right = item2;
            item2->parent = pNVar1->parent;
            item2 = item2->parent;
          }
          else if ((pNVar1->parent->right == pNVar1) && (pNVar1->parent->left == (Node *)0x0)) {
            pNVar1->parent->left = item2;
            item2->parent = pNVar1->parent;
            item2 = item2->parent;
          }
          else if (pNVar1->parent->left == pNVar1) {
            pNVar11 = (Node *)operator_new(0x50);
            Node::Node(pNVar11);
            pNVar11->left = item2;
            pNVar11->right = pNVar1;
            item2->parent = pNVar11;
            pNVar7 = pNVar1->parent;
            pNVar1->parent = pNVar11;
            pNVar7->left = pNVar11;
            item2 = pNVar11;
            iVar12 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&pNVar11->left->key);
            iVar13 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&item2->left->key);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar11,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar12._M_current,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar13._M_current);
            for (iVar15 = 0;
                sVar14 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&item2->right->key), pNVar11 = item2, (ulong)(long)iVar15 < sVar14;
                iVar15 = iVar15 + 1) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&item2->right->key,(long)iVar15);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&pNVar11->key,pvVar6);
            }
            add_hash((hash_add_key *)&stack0xffffffffffeffbb0,this,item2->left->hashn,
                     item2->right->hashn);
            hasha._0_8_ = in_stack_ffffffffffeffbb8;
            hasha._8_8_ = in_stack_ffffffffffeffbc0;
            hasha._16_8_ = in_stack_ffffffffffeffbc8;
            sha256((uint8_t *)&i,0x40,hasha.ahash2 + 0xe);
            *(undefined8 *)item2->hashn = hasha._56_8_;
            *(undefined8 *)(item2->hashn + 2) = newhash._0_8_;
            *(undefined8 *)(item2->hashn + 4) = newhash._8_8_;
            *(undefined8 *)(item2->hashn + 6) = newhash._16_8_;
            item2 = pNVar7;
          }
          else {
            pNVar11 = (Node *)operator_new(0x50);
            Node::Node(pNVar11);
            pNVar11->left = item2;
            pNVar11->right = pNVar1;
            item2->parent = pNVar11;
            pNVar7 = pNVar1->parent;
            pNVar1->parent = pNVar11;
            pNVar7->right = pNVar11;
            item2 = pNVar11;
            iVar12 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&pNVar11->left->key);
            iVar13 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&item2->left->key);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar11,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar12._M_current,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )iVar13._M_current);
            for (iVar15 = 0;
                sVar14 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&item2->right->key), pNVar11 = item2, (ulong)(long)iVar15 < sVar14;
                iVar15 = iVar15 + 1) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&item2->right->key,(long)iVar15);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&pNVar11->key,pvVar6);
            }
            add_hash((hash_add_key *)&stack0xffffffffffeffb58,this,item2->left->hashn,
                     item2->right->hashn);
            hasha._0_8_ = in_stack_ffffffffffeffb60;
            hasha._8_8_ = in_stack_ffffffffffeffb68;
            hasha._16_8_ = in_stack_ffffffffffeffb70;
            sha256((uint8_t *)&i,0x40,hasha.ahash2 + 0xe);
            *(undefined8 *)item2->hashn = hasha._56_8_;
            *(undefined8 *)(item2->hashn + 2) = newhash._0_8_;
            *(undefined8 *)(item2->hashn + 4) = newhash._8_8_;
            *(undefined8 *)(item2->hashn + 6) = newhash._16_8_;
            item2 = pNVar7;
          }
          for (; pNVar7 = item2, item2 != (Node *)0x0; item2 = item2->parent) {
            if (item2->right == (Node *)0x0) {
              iVar12 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&item2->left->key);
              iVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&item2->left->key);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar7
                         ,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )iVar12._M_current,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )iVar13._M_current);
              pNVar7 = item2->left;
              hasha._0_8_ = *(undefined8 *)(pNVar7->hashn + 2);
              hasha._8_8_ = *(undefined8 *)(pNVar7->hashn + 4);
              hasha._16_8_ = *(undefined8 *)(pNVar7->hashn + 6);
              sha256((uint8_t *)&i,0x40,hasha.ahash2 + 0xe);
              *(undefined8 *)item2->hashn = hasha._56_8_;
              *(undefined8 *)(item2->hashn + 2) = newhash._0_8_;
              *(undefined8 *)(item2->hashn + 4) = newhash._8_8_;
              *(undefined8 *)(item2->hashn + 6) = newhash._16_8_;
            }
            else if (item2->left == (Node *)0x0) {
              iVar12 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&item2->right->key);
              iVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&item2->right->key);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar7
                         ,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )iVar12._M_current,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )iVar13._M_current);
              pNVar7 = item2->right;
              hasha._0_8_ = *(undefined8 *)(pNVar7->hashn + 2);
              hasha._8_8_ = *(undefined8 *)(pNVar7->hashn + 4);
              hasha._16_8_ = *(undefined8 *)(pNVar7->hashn + 6);
              sha256((uint8_t *)&i,0x40,hasha.ahash2 + 0xe);
              *(undefined8 *)item2->hashn = hasha._56_8_;
              *(undefined8 *)(item2->hashn + 2) = newhash._0_8_;
              *(undefined8 *)(item2->hashn + 4) = newhash._8_8_;
              *(undefined8 *)(item2->hashn + 6) = newhash._16_8_;
            }
            else {
              iVar12 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&item2->left->key);
              iVar13 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&item2->left->key);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar7
                         ,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           )iVar12._M_current,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )iVar13._M_current);
              for (iVar15 = 0;
                  sVar14 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size(&item2->right->key), pNVar7 = item2, (ulong)(long)iVar15 < sVar14;
                  iVar15 = iVar15 + 1) {
                pvVar6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&item2->right->key,(long)iVar15);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pNVar7->key,pvVar6);
              }
              add_hash((hash_add_key *)&stack0xffffffffffeffae0,this,item2->left->hashn,
                       item2->right->hashn);
              hasha._0_8_ = in_stack_ffffffffffeffae8;
              hasha._8_8_ = in_stack_ffffffffffeffaf0;
              hasha._16_8_ = in_stack_ffffffffffeffaf8;
              sha256((uint8_t *)&i,0x40,hasha.ahash2 + 0xe);
              *(undefined8 *)item2->hashn = hasha._56_8_;
              *(undefined8 *)(item2->hashn + 2) = newhash._0_8_;
              *(undefined8 *)(item2->hashn + 4) = newhash._8_8_;
              *(undefined8 *)(item2->hashn + 6) = newhash._16_8_;
            }
          }
          iVar15 = 1;
        }
        else {
          poVar9 = std::operator<<((ostream *)&std::cout,"Failed open the file");
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffeffc50,(string *)&this->folder_name1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffeffc30,"/",(allocator *)&stack0xffffffffffeffc2f);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffeffc70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffeffc50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffeffc90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffeffc70);
          poVar9 = std::operator<<(poVar9,(string *)&stack0xffffffffffeffc90);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&stack0xffffffffffeffc90);
          std::__cxx11::string::~string((string *)&stack0xffffffffffeffc70);
          std::__cxx11::string::~string((string *)&stack0xffffffffffeffc30);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffeffc2f);
          std::__cxx11::string::~string((string *)&stack0xffffffffffeffc50);
          iVar15 = 5;
        }
        std::ifstream::~ifstream(&stack0xffffffffffeffd38);
        if (iVar15 == 1) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void M_tree::insert_leaf(string key, int n) {
    char byte_file[1024*1024];
    Node * item;
    Node * item2;
    Node * leaff;
    Node * up;
    uint32_t newhash[8];
    hash_add_key hasha;
    switch (n) {
        case 1:
        {
            int n = file_names_p.size();
            for(int i=0;i<n;i++){
                if(key < file_names_p[i]){
                    // finish insert
                    item = new(Node);
                    item->right = NULL;
                    item->left = NULL;
                    item->key.push_back(key);
                    ifstream file((string(folder_name1)+string("/")+key).c_str(), ios::in | ios::binary);
                    if(!file){
                        cout << "Failed open the file" << string(folder_name1)+string("/")+key << endl;
                        continue;
                    }
                    memset(byte_file, 0, sizeof(byte_file));
                    file.read(reinterpret_cast<char *>(&byte_file), sizeof(byte_file));
                    cout << "inserting the file: " << key << endl;                //output the file names
                    sha256((uint8_t*)byte_file,file.gcount(), item->hashn);
                    file.close();
                    leaff = point_p[i];
                    point_p.insert(point_p.begin()+i, item);
                    if(leaff->parent->left == leaff && leaff->parent->right == NULL){
                        leaff->parent->right = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else if(leaff->parent->right == leaff && leaff->parent->left == NULL){
                        leaff->parent->left = item;
                        item->parent = leaff->parent;
                        item = item->parent;
                    }
                    else{
                        if(leaff->parent->left == leaff){
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->left = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                        else{
                            item2 = new(Node);
                            item2->left = item;
                            item2->right = leaff;
                            item->parent = item2;
                            item = item2;
                            item2 = leaff->parent;
                            leaff->parent = item;
                            item2->right = item;
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                            item = item2;
                        }
                    }
                    // start update hash and keys
                    while (item!=NULL){
                        if(item->right == NULL){
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            memcpy(hasha.ahash2, item->left->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else if(item->left == NULL){
                            item->key.assign(item->right->key.begin(), item->right->key.end());
                            memcpy(hasha.ahash2, item->right->hashn, 32);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        else{
                            int j;
                            item->key.assign(item->left->key.begin(), item->left->key.end());
                            for (j=0;j<item->right->key.size();j++){
                                item->key.push_back(item->right->key[j]);
                            }
                            hasha = add_hash(item->left->hashn, item->right->hashn);
                            sha256(hasha.ahash, 64, newhash);
                            memcpy(item->hashn, newhash, 32);
                        }
                        item = item->parent;
                    }
                    return;
                }
            }
            break;
        }
        default:{
            return;
        }
    }
}